

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void ravi_create_slice(lua_State *L,int idx,uint start,uint len)

{
  StkId pTVar1;
  int iVar2;
  TValue *parent_00;
  RaviArray *pRVar3;
  RaviArray *x__1;
  TValue *io_1;
  RaviArray *x_;
  TValue *io;
  uint slice_len;
  RaviArray *orig;
  char *errmsg;
  RaviArray *slice;
  TValue *parent;
  uint len_local;
  uint start_local;
  int idx_local;
  lua_State *L_local;
  
  orig = (RaviArray *)0x0;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x37c,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
  }
  parent_00 = index2addr(L,idx);
  if ((parent_00->tt_ & 0xf) == 5) {
    if (parent_00->tt_ == 0x8005) {
      orig = (RaviArray *)anon_var_dwarf_a57c;
    }
    else {
      if ((parent_00->tt_ != 0x8015) && (parent_00->tt_ != 0x8025)) {
        __assert_fail("(((((parent))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((parent))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x386,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)")
        ;
      }
      if ((((parent_00->value_).gc)->tt != '\x15') && (((parent_00->value_).gc)->tt != '%')) {
        __assert_fail("((((parent)->value_).gc)->tt == ((5) | ((1) << 4)) || (((parent)->value_).gc)->tt == ((5) | ((2) << 4)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x386,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)")
        ;
      }
      if (((start == 0) || (start + len <= start)) ||
         (*(uint *)((parent_00->value_).f + 0xc) < start + len)) {
        orig = (RaviArray *)anon_var_dwarf_a5b8;
      }
      else {
        pRVar3 = raviH_new_slice(L,parent_00,start,len);
        if (parent_00->tt_ == 0x8025) {
          pTVar1 = L->top;
          if (9 < (pRVar3->tt & 0xf)) {
            __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x38e,
                          "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
          }
          (pTVar1->value_).gc = (GCObject *)pRVar3;
          pTVar1->tt_ = 0x8025;
          if ((pTVar1->tt_ & 0x8000) != 0) {
            if ((pTVar1->tt_ & 0x8000) == 0) {
              __assert_fail("(((io)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x38e,
                            "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
            }
            if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0012b4bb:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x38e,
                            "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
            }
            if (L != (lua_State *)0x0) {
              if ((pTVar1->tt_ & 0x8000) == 0) {
                __assert_fail("(((io)->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                              ,0x38e,
                              "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)"
                             );
              }
              if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
              goto LAB_0012b4bb;
            }
          }
        }
        else {
          pTVar1 = L->top;
          if (9 < (pRVar3->tt & 0xf)) {
            __assert_fail("(((x_)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x391,
                          "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
          }
          (pTVar1->value_).gc = (GCObject *)pRVar3;
          pTVar1->tt_ = 0x8015;
          if ((pTVar1->tt_ & 0x8000) != 0) {
            if ((pTVar1->tt_ & 0x8000) == 0) {
              __assert_fail("(((io)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x391,
                            "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
            }
            if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_0012b5ff:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x391,
                            "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
            }
            if (L != (lua_State *)0x0) {
              if ((pTVar1->tt_ & 0x8000) == 0) {
                __assert_fail("(((io)->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                              ,0x391,
                              "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)"
                             );
              }
              if ((((pTVar1->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)
              goto LAB_0012b5ff;
            }
          }
        }
        L->top = L->top + 1;
        if (L->ci->top < L->top) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x393,
                        "void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
        }
        if (0 < L->l_G->GCdebt) {
          luaC_step(L);
        }
      }
    }
  }
  else {
    orig = (RaviArray *)0x19ed17;
  }
  if (orig != (RaviArray *)0x0) {
    luaG_runerror(L,(char *)orig);
  }
  iVar2 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x399,"void ravi_create_slice(lua_State *, int, unsigned int, unsigned int)");
}

Assistant:

LUA_API void ravi_create_slice(lua_State *L, int idx, unsigned int start,
                               unsigned int len) {
  TValue *parent;
  RaviArray *slice;
  const char *errmsg = NULL;
  lua_lock(L);
  parent = index2addr(L, idx);
  if (!ttistable(parent)) {
    errmsg = "integer[] or number[] expected";
    goto done;
  }
  if (ttisLtable(parent)) {
    errmsg = "cannot create a slice of a table, integer[] or number[] expected";
    goto done;
  }
  RaviArray *orig = arrvalue(parent);
  unsigned int slice_len = start + len;
  if (start < 1 || slice_len <= start || slice_len > orig->len) {
    errmsg = "cannot create a slice of given bounds";
    goto done;
  }
  slice = raviH_new_slice(L, parent, start, len);
  if (ttisfarray(parent)) {
    setfarrayvalue(L, L->top, slice);
  }
  else {
    setiarrayvalue(L, L->top, slice);
  }
  api_incr_top(L);
  luaC_checkGC(L);
done:
  if (errmsg)
    luaG_runerror(L, errmsg);
  else
    lua_unlock(L);
}